

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar58;
  int iVar59;
  ulong uVar60;
  long *in_RSI;
  long lVar61;
  long in_RDI;
  undefined1 (*pauVar62) [32];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  __m128 _p_15;
  __m128 _b_3;
  __m128 _a_3;
  __m256 _p_14;
  __m256 _b_avx_1;
  __m256 _a_avx_1;
  int i_10;
  float *ptr_4;
  float b_2;
  float a_2;
  int q_3;
  float *beta_2;
  float *gamma_2;
  float scale2_2;
  float scale1_2;
  float tmp_2;
  __m128 _p_13;
  __m128 _mean_2;
  __m128 _sqsum_2;
  __m256 _p_12;
  __m256 _mean_avx_2;
  __m256 _sqsum_avx_2;
  int i_9;
  float *ptr_3;
  int q_2;
  float sqsum_2;
  float mean_2;
  __m128 _sum_2;
  __m256 _sum_avx_2;
  int i_8;
  float *ptr_2;
  int q_1;
  float sum_2;
  Mat beta_data_g_2;
  Mat gamma_data_g_2;
  Mat bottom_top_blob_g_2;
  int g_2;
  int size_1;
  int d;
  int h;
  int w_1;
  __m128 _p_11;
  __m128 _scale2_2;
  __m128 _scale1_2;
  __m256 _p_10;
  __m256 _scale2_avx_2;
  __m256 _scale1_avx_2;
  int i_7;
  __m128 _p_9;
  __m128 _b_2;
  __m128 _a_2;
  __m256 _p_8;
  __m256 _b_avx;
  __m256 _a_avx;
  int i_6;
  float b_1;
  float a_1;
  int q;
  float *beta_1;
  float *gamma_1;
  float scale2_1;
  float scale1_1;
  float tmp_1;
  __m128 _p_7;
  __m128 _mean_1;
  __m128 _sqsum_1;
  __m256 _p_6;
  __m256 _mean_avx_1;
  __m256 _sqsum_avx_1;
  int i_5;
  float sqsum_1;
  float mean_1;
  __m128 _sum_1;
  __m256 _sum_avx_1;
  int i_4;
  float *ptr_1;
  float sum_1;
  Mat beta_data_g_1;
  Mat gamma_data_g_1;
  Mat bottom_top_blob_g_1;
  int g_1;
  int size;
  int w;
  __m128 _p_5;
  __m128 _scale2_1;
  __m128 _scale1_1;
  __m256 _p_4;
  __m256 _scale2_avx_1;
  __m256 _scale1_avx_1;
  int i_3;
  float b;
  float a;
  __m128 _b_1;
  __m128 _a_1;
  __m128 _p_3;
  __m128 _beta_1;
  __m128 _gamma_1;
  __m128 _scale2;
  __m128 _scale1;
  __m256 _b;
  __m256 _a;
  __m256 _p_2;
  __m256 _beta;
  __m256 _gamma;
  __m256 _scale2_avx;
  __m256 _scale1_avx;
  float *beta;
  float *gamma;
  int i_2;
  float scale2;
  float scale1;
  float tmp;
  __m128 _p_1;
  __m128 _mean;
  __m128 _sqsum;
  __m256 _p;
  __m256 _mean_avx;
  __m256 _sqsum_avx;
  int i_1;
  float sqsum;
  float mean;
  __m128 _sum;
  __m256 _sum_avx;
  int i;
  float *ptr;
  float sum;
  Mat beta_data_g;
  Mat gamma_data_g;
  Mat bottom_top_blob_g;
  int g;
  int channels_per_group;
  int dims;
  __m128 x32_10;
  __m128 x64_10;
  __m128 x128_5;
  __m128 x32_8;
  __m128 x64_8;
  __m128 x128_4;
  __m128 x32_6;
  __m128 x64_6;
  __m128 x128_3;
  __m128 x32_4;
  __m128 x64_4;
  __m128 x128_2;
  __m128 x32_2;
  __m128 x64_2;
  __m128 x128_1;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m128 x32_11;
  __m128 x64_11;
  __m128 x32_9;
  __m128 x64_9;
  __m128 x32_7;
  __m128 x64_7;
  __m128 x32_5;
  __m128 x64_5;
  __m128 x32_3;
  __m128 x64_3;
  __m128 x32_1;
  __m128 x64_1;
  Mat *m;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 local_3180;
  undefined8 uStack_3178;
  int local_2f14;
  undefined1 (*local_2ec8) [32];
  float local_2ebc;
  float local_2eb8;
  int local_2eb4;
  float *local_2eb0;
  float *local_2ea8;
  undefined8 local_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  int local_2df4;
  undefined1 (*local_2da8) [32];
  int local_2d9c;
  float local_2d98;
  undefined8 local_2d90;
  undefined8 uStack_2d88;
  float local_2d80;
  float fStack_2d7c;
  float fStack_2d78;
  float fStack_2d74;
  float fStack_2d70;
  float fStack_2d6c;
  float fStack_2d68;
  float fStack_2d64;
  int local_2d5c;
  float *local_2d10;
  int local_2d08;
  float local_2d04;
  int local_2c24;
  int local_2b74;
  int local_2ae0;
  int local_2ad4;
  uint *local_2ad0;
  float *local_2ac8;
  undefined8 local_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  int local_2a1c;
  float local_2a18;
  undefined8 local_2a10;
  undefined8 uStack_2a08;
  float local_2a00;
  float fStack_29fc;
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  float fStack_29e4;
  int local_29cc;
  undefined1 (*local_29c8) [32];
  float local_29bc;
  int local_28dc;
  int local_283c;
  undefined1 (*local_26d0) [32];
  undefined1 (*local_26c8) [32];
  int local_26c0;
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined8 local_2640;
  undefined8 uStack_2638;
  int local_261c;
  float local_2618;
  undefined8 local_2610;
  undefined8 uStack_2608;
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  int local_25cc;
  undefined1 (*local_25c8) [32];
  float local_25bc;
  int local_24cc;
  undefined8 uStack_2378;
  undefined8 uStack_2338;
  float local_2300;
  float fStack_22fc;
  float fStack_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  float fStack_22e8;
  float fStack_22e4;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  float fStack_22a8;
  float fStack_22a4;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  float local_1f30;
  float fStack_1f2c;
  float local_1ef0;
  float fStack_1eec;
  float local_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  float local_1eb0;
  float fStack_1eac;
  float local_1e70;
  float fStack_1e6c;
  float local_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  float local_1e30;
  float fStack_1e2c;
  float local_1df0;
  float fStack_1dec;
  float local_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float local_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float local_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float local_1cb0;
  float fStack_1cac;
  float local_1ca0;
  float fStack_1c9c;
  float local_1c60;
  float fStack_1c5c;
  float local_1c10;
  float fStack_1c0c;
  float local_1c00;
  float fStack_1bfc;
  float local_1bc0;
  float fStack_1bbc;
  float local_1b70;
  float fStack_1b6c;
  float local_1b60;
  float fStack_1b5c;
  float local_1b20;
  float fStack_1b1c;
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  undefined4 uStack_15c4;
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  
  iVar59 = (int)in_RSI[5];
  iVar57 = *(int *)(in_RDI + 0xd4) / *(int *)(in_RDI + 0xd0);
  if (iVar59 == 1) {
    for (local_24cc = 0; local_24cc < *(int *)(in_RDI + 0xd0); local_24cc = local_24cc + 1) {
      pauVar62 = (undefined1 (*) [32])(*in_RSI + (long)(local_24cc * iVar57) * in_RSI[2]);
      local_26c8 = (undefined1 (*) [32])
                   (*(long *)(in_RDI + 0xe0) +
                   (long)(local_24cc * iVar57) * *(long *)(in_RDI + 0xf0));
      local_26d0 = (undefined1 (*) [32])
                   (*(long *)(in_RDI + 0x128) +
                   (long)(local_24cc * iVar57) * *(long *)(in_RDI + 0x138));
      local_2600 = 0.0;
      fStack_25fc = 0.0;
      fStack_25f8 = 0.0;
      fStack_25f4 = 0.0;
      fStack_25f0 = 0.0;
      fStack_25ec = 0.0;
      fStack_25e8 = 0.0;
      fStack_25e4 = 0.0;
      local_25c8 = pauVar62;
      for (local_25cc = 0; local_25cc + 7 < iVar57; local_25cc = local_25cc + 8) {
        local_2280 = (float)*(undefined8 *)*local_25c8;
        fStack_227c = (float)((ulong)*(undefined8 *)*local_25c8 >> 0x20);
        fStack_2278 = (float)*(undefined8 *)(*local_25c8 + 8);
        fStack_2274 = (float)((ulong)*(undefined8 *)(*local_25c8 + 8) >> 0x20);
        fStack_2270 = (float)*(undefined8 *)(*local_25c8 + 0x10);
        fStack_226c = (float)((ulong)*(undefined8 *)(*local_25c8 + 0x10) >> 0x20);
        fStack_2268 = (float)*(undefined8 *)(*local_25c8 + 0x18);
        fStack_2264 = (float)((ulong)*(undefined8 *)(*local_25c8 + 0x18) >> 0x20);
        local_2600 = local_2600 + local_2280;
        fStack_25fc = fStack_25fc + fStack_227c;
        fStack_25f8 = fStack_25f8 + fStack_2278;
        fStack_25f4 = fStack_25f4 + fStack_2274;
        fStack_25f0 = fStack_25f0 + fStack_2270;
        fStack_25ec = fStack_25ec + fStack_226c;
        fStack_25e8 = fStack_25e8 + fStack_2268;
        fStack_25e4 = fStack_25e4 + fStack_2264;
        local_25c8 = local_25c8 + 1;
      }
      uVar8 = CONCAT44(fStack_25ec + fStack_25fc,fStack_25f0 + local_2600);
      uVar9 = CONCAT44(fStack_25e4 + fStack_25f4,fStack_25e8 + fStack_25f8);
      auVar26._8_8_ = uVar9;
      auVar26._0_8_ = uVar8;
      auVar25._8_8_ = uVar9;
      auVar25._0_8_ = uVar8;
      auVar7 = vunpckhpd_avx(auVar25,auVar26);
      local_1f30 = auVar7._0_4_;
      fStack_1f2c = auVar7._4_4_;
      local_2610 = 0;
      uStack_2608 = 0;
      while( true ) {
        local_1d60 = (float)local_2610;
        fStack_1d5c = (float)((ulong)local_2610 >> 0x20);
        fStack_1d58 = (float)uStack_2608;
        fStack_1d54 = (float)((ulong)uStack_2608 >> 0x20);
        if (iVar57 <= local_25cc + 3) break;
        local_1d70 = (float)*(undefined8 *)*local_25c8;
        fStack_1d6c = (float)((ulong)*(undefined8 *)*local_25c8 >> 0x20);
        fStack_1d68 = (float)*(undefined8 *)(*local_25c8 + 8);
        fStack_1d64 = (float)((ulong)*(undefined8 *)(*local_25c8 + 8) >> 0x20);
        local_2610 = CONCAT44(fStack_1d5c + fStack_1d6c,local_1d60 + local_1d70);
        uStack_2608 = CONCAT44(fStack_1d54 + fStack_1d64,fStack_1d58 + fStack_1d68);
        local_25c8 = (undefined1 (*) [32])(*local_25c8 + 0x10);
        local_25cc = local_25cc + 4;
      }
      auVar16._8_8_ = uStack_2608;
      auVar16._0_8_ = local_2610;
      auVar15._8_8_ = uStack_2608;
      auVar15._0_8_ = local_2610;
      auVar7 = vunpckhpd_avx(auVar15,auVar16);
      local_1b20 = auVar7._0_4_;
      fStack_1b1c = auVar7._4_4_;
      local_25bc = local_1d60 + local_1b20 + fStack_1d5c + fStack_1b1c +
                   fStack_25f0 + local_2600 + local_1f30 + fStack_25ec + fStack_25fc + fStack_1f2c +
                   0.0;
      for (; local_25cc < iVar57; local_25cc = local_25cc + 1) {
        local_25bc = *(float *)*local_25c8 + local_25bc;
        local_25c8 = (undefined1 (*) [32])(*local_25c8 + 4);
      }
      local_25bc = local_25bc / (float)iVar57;
      local_261c = 0;
      uStack_2338 = SUB328(ZEXT832(0),4);
      local_2640 = 0;
      uStack_2638 = uStack_2338;
      auVar7 = vinsertps_avx(ZEXT416((uint)local_25bc),ZEXT416((uint)local_25bc),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_25bc),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_25bc),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)local_25bc),ZEXT416((uint)local_25bc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_25bc),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_25bc),0x30);
      uStack_c70 = auVar7._0_8_;
      uStack_c68 = auVar7._8_8_;
      local_25c8 = pauVar62;
      for (; local_261c + 7 < iVar57; local_261c = local_261c + 8) {
        auVar11._16_8_ = uStack_c70;
        auVar11._0_16_ = auVar2;
        auVar11._24_8_ = uStack_c68;
        auVar69 = vsubps_avx(*local_25c8,auVar11);
        auVar7 = vfmadd213ps_fma(auVar69,auVar69,ZEXT1632(CONCAT88(uStack_2638,local_2640)));
        local_3180 = auVar7._0_8_;
        local_2640 = local_3180;
        uStack_3178 = auVar7._8_8_;
        uStack_2638 = uStack_3178;
        local_25c8 = local_25c8 + 1;
      }
      local_1ed0 = (float)local_2640;
      fStack_1ecc = (float)((ulong)local_2640 >> 0x20);
      fStack_1ec8 = (float)uStack_2638;
      fStack_1ec4 = (float)((ulong)uStack_2638 >> 0x20);
      uVar8 = CONCAT44(fStack_1ecc + 0.0,local_1ed0 + 0.0);
      uVar9 = CONCAT44(fStack_1ec4 + 0.0,fStack_1ec8 + 0.0);
      auVar28._8_8_ = uVar9;
      auVar28._0_8_ = uVar8;
      auVar27._8_8_ = uVar9;
      auVar27._0_8_ = uVar8;
      auVar7 = vunpckhpd_avx(auVar27,auVar28);
      local_1ef0 = auVar7._0_4_;
      fStack_1eec = auVar7._4_4_;
      local_2690 = 0;
      uStack_2688 = 0;
      auVar14._4_4_ = local_25bc;
      auVar14._0_4_ = local_25bc;
      auVar14._12_4_ = local_25bc;
      auVar14._8_4_ = local_25bc;
      for (; local_261c + 3 < iVar57; local_261c = local_261c + 4) {
        auVar7 = vsubps_avx(*(undefined1 (*) [16])*local_25c8,auVar14);
        auVar56._8_8_ = uStack_2688;
        auVar56._0_8_ = local_2690;
        auVar7 = vfmadd213ps_fma(auVar7,auVar7,auVar56);
        local_31e0 = auVar7._0_8_;
        local_2690 = local_31e0;
        uStack_31d8 = auVar7._8_8_;
        uStack_2688 = uStack_31d8;
        local_25c8 = (undefined1 (*) [32])(*local_25c8 + 0x10);
      }
      auVar18._8_8_ = uStack_2688;
      auVar18._0_8_ = local_2690;
      auVar17._8_8_ = uStack_2688;
      auVar17._0_8_ = local_2690;
      auVar7 = vunpckhpd_avx(auVar17,auVar18);
      local_1b60 = (float)local_2690;
      fStack_1b5c = (float)((ulong)local_2690 >> 0x20);
      local_1b70 = auVar7._0_4_;
      fStack_1b6c = auVar7._4_4_;
      local_2618 = local_1b60 + local_1b70 + fStack_1b5c + fStack_1b6c +
                   local_1ed0 + 0.0 + local_1ef0 + fStack_1ecc + 0.0 + fStack_1eec + 0.0;
      for (; local_261c < iVar57; local_261c = local_261c + 1) {
        fVar65 = *(float *)*local_25c8 - local_25bc;
        local_2618 = fVar65 * fVar65 + local_2618;
        local_25c8 = (undefined1 (*) [32])(*local_25c8 + 4);
      }
      auVar66._0_4_ = local_2618 / (float)iVar57;
      auVar66._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar7 = vsqrtss_avx(auVar66,ZEXT416((uint)(auVar66._0_4_ + *(float *)(in_RDI + 0xd8))));
      fVar63 = 1.0 / auVar7._0_4_;
      fVar65 = -local_25bc * fVar63;
      if (*(int *)(in_RDI + 0xdc) == 0) {
        local_283c = 0;
        auVar7 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar63),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar63),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar63),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar63),0x30);
        uStack_bb0 = auVar7._0_8_;
        uStack_ba8 = auVar7._8_8_;
        auVar7 = vinsertps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar65),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar65),0x30);
        auVar3 = vinsertps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar65),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar65),0x30);
        uStack_b70 = auVar7._0_8_;
        uStack_b68 = auVar7._8_8_;
        local_25c8 = pauVar62;
        for (; local_283c + 7 < iVar57; local_283c = local_283c + 8) {
          auVar51._16_8_ = uStack_bb0;
          auVar51._0_16_ = auVar2;
          auVar51._24_8_ = uStack_ba8;
          auVar50._16_8_ = uStack_b70;
          auVar50._0_16_ = auVar3;
          auVar50._24_8_ = uStack_b68;
          auVar7 = vfmadd213ps_fma(auVar51,*local_25c8,auVar50);
          local_3480 = auVar7._0_8_;
          uStack_3478 = auVar7._8_8_;
          *(undefined8 *)*local_25c8 = local_3480;
          *(undefined8 *)(*local_25c8 + 8) = uStack_3478;
          *(undefined8 *)(*local_25c8 + 0x10) = 0;
          *(undefined8 *)(*local_25c8 + 0x18) = 0;
          local_25c8 = local_25c8 + 1;
        }
        auVar49._4_4_ = fVar63;
        auVar49._0_4_ = fVar63;
        auVar49._12_4_ = fVar63;
        auVar49._8_4_ = fVar63;
        auVar48._4_4_ = fVar65;
        auVar48._0_4_ = fVar65;
        auVar48._12_4_ = fVar65;
        auVar48._8_4_ = fVar65;
        for (; local_283c + 3 < iVar57; local_283c = local_283c + 4) {
          auVar7 = vfmadd213ps_fma(auVar49,*(undefined1 (*) [16])*local_25c8,auVar48);
          local_34c0 = auVar7._0_8_;
          uStack_34b8 = auVar7._8_8_;
          *(undefined8 *)*local_25c8 = local_34c0;
          *(undefined8 *)(*local_25c8 + 8) = uStack_34b8;
          local_25c8 = (undefined1 (*) [32])(*local_25c8 + 0x10);
        }
        for (; local_283c < iVar57; local_283c = local_283c + 1) {
          *(float *)*local_25c8 = *(float *)*local_25c8 * fVar63 + fVar65;
          local_25c8 = (undefined1 (*) [32])(*local_25c8 + 4);
        }
      }
      else {
        local_26c0 = 0;
        auVar7 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar63),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar63),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar63),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar63),0x30);
        auVar3 = vinsertps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar65),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar65),0x30);
        auVar4 = vinsertps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar65),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar65),0x30);
        uStack_bf0 = auVar3._0_8_;
        uStack_be8 = auVar3._8_8_;
        local_25c8 = pauVar62;
        for (; local_26c0 + 7 < iVar57; local_26c0 = local_26c0 + 8) {
          local_15e0 = (float)*(undefined8 *)*local_26c8;
          fStack_15dc = (float)((ulong)*(undefined8 *)*local_26c8 >> 0x20);
          fStack_15d8 = (float)*(undefined8 *)(*local_26c8 + 8);
          fStack_15d4 = (float)((ulong)*(undefined8 *)(*local_26c8 + 8) >> 0x20);
          fStack_15d0 = (float)*(undefined8 *)(*local_26c8 + 0x10);
          fStack_15cc = (float)((ulong)*(undefined8 *)(*local_26c8 + 0x10) >> 0x20);
          fStack_15c8 = (float)*(undefined8 *)(*local_26c8 + 0x18);
          uStack_15c4 = (undefined4)((ulong)*(undefined8 *)(*local_26c8 + 0x18) >> 0x20);
          local_1600 = auVar2._0_4_;
          fStack_15fc = auVar2._4_4_;
          fStack_15f8 = auVar2._8_4_;
          fStack_15f4 = auVar2._12_4_;
          fStack_15f0 = auVar7._0_4_;
          fStack_15ec = auVar7._4_4_;
          fStack_15e8 = auVar7._8_4_;
          auVar54._4_4_ = fStack_15dc * fStack_15fc;
          auVar54._0_4_ = local_15e0 * local_1600;
          auVar54._12_4_ = fStack_15d4 * fStack_15f4;
          auVar54._8_4_ = fStack_15d8 * fStack_15f8;
          auVar54._20_4_ = fStack_15cc * fStack_15ec;
          auVar54._16_4_ = fStack_15d0 * fStack_15f0;
          auVar54._28_4_ = uStack_15c4;
          auVar54._24_4_ = fStack_15c8 * fStack_15e8;
          auVar55._16_8_ = uStack_bf0;
          auVar55._0_16_ = auVar4;
          auVar55._24_8_ = uStack_be8;
          auVar3 = vfmadd213ps_fma(auVar55,*local_26c8,*local_26d0);
          auVar3 = vfmadd213ps_fma(auVar54,*local_25c8,ZEXT1632(auVar3));
          local_3340 = auVar3._0_8_;
          uStack_3338 = auVar3._8_8_;
          *(undefined8 *)*local_25c8 = local_3340;
          *(undefined8 *)(*local_25c8 + 8) = uStack_3338;
          *(undefined8 *)(*local_25c8 + 0x10) = 0;
          *(undefined8 *)(*local_25c8 + 0x18) = 0;
          local_26c8 = local_26c8 + 1;
          local_26d0 = local_26d0 + 1;
          local_25c8 = local_25c8 + 1;
        }
        auVar53._4_4_ = fVar65;
        auVar53._0_4_ = fVar65;
        auVar53._12_4_ = fVar65;
        auVar53._8_4_ = fVar65;
        for (; local_26c0 + 3 < iVar57; local_26c0 = local_26c0 + 4) {
          local_1470 = (float)*(undefined8 *)*local_26c8;
          fStack_146c = (float)((ulong)*(undefined8 *)*local_26c8 >> 0x20);
          fStack_1468 = (float)*(undefined8 *)(*local_26c8 + 8);
          fStack_1464 = (float)((ulong)*(undefined8 *)(*local_26c8 + 8) >> 0x20);
          auVar52._4_4_ = fStack_146c * fVar63;
          auVar52._0_4_ = local_1470 * fVar63;
          auVar52._12_4_ = fStack_1464 * fVar63;
          auVar52._8_4_ = fStack_1468 * fVar63;
          auVar7 = vfmadd213ps_fma(auVar53,*(undefined1 (*) [16])*local_26c8,
                                   *(undefined1 (*) [16])*local_26d0);
          auVar7 = vfmadd213ps_fma(auVar52,*(undefined1 (*) [16])*local_25c8,auVar7);
          local_33c0 = auVar7._0_8_;
          uStack_33b8 = auVar7._8_8_;
          *(undefined8 *)*local_25c8 = local_33c0;
          *(undefined8 *)(*local_25c8 + 8) = uStack_33b8;
          local_26c8 = (undefined1 (*) [32])(*local_26c8 + 0x10);
          local_26d0 = (undefined1 (*) [32])(*local_26d0 + 0x10);
          local_25c8 = (undefined1 (*) [32])(*local_25c8 + 0x10);
        }
        for (; local_26c0 < iVar57; local_26c0 = local_26c0 + 1) {
          *(float *)*local_25c8 =
               *(float *)*local_25c8 * *(float *)*local_26c8 * fVar63 +
               *(float *)*local_26c8 * fVar65 + *(float *)*local_26d0;
          local_26c8 = (undefined1 (*) [32])(*local_26c8 + 4);
          local_26d0 = (undefined1 (*) [32])(*local_26d0 + 4);
          local_25c8 = (undefined1 (*) [32])(*local_25c8 + 4);
        }
      }
    }
  }
  else if (iVar59 == 2) {
    iVar59 = *(int *)((long)in_RSI + 0x2c);
    iVar58 = iVar57 * iVar59;
    for (local_28dc = 0; local_28dc < *(int *)(in_RDI + 0xd0); local_28dc = local_28dc + 1) {
      pauVar62 = (undefined1 (*) [32])
                 (*in_RSI +
                 (long)*(int *)((long)in_RSI + 0x2c) * (long)(local_28dc * iVar57) * in_RSI[2]);
      local_2ac8 = (float *)(*(long *)(in_RDI + 0xe0) +
                            (long)(local_28dc * iVar57) * *(long *)(in_RDI + 0xf0));
      local_2ad0 = (uint *)(*(long *)(in_RDI + 0x128) +
                           (long)(local_28dc * iVar57) * *(long *)(in_RDI + 0x138));
      local_2a00 = 0.0;
      fStack_29fc = 0.0;
      fStack_29f8 = 0.0;
      fStack_29f4 = 0.0;
      fStack_29f0 = 0.0;
      fStack_29ec = 0.0;
      fStack_29e8 = 0.0;
      fStack_29e4 = 0.0;
      local_29c8 = pauVar62;
      for (local_29cc = 0; local_29cc + 7 < iVar58; local_29cc = local_29cc + 8) {
        local_22c0 = (float)*(undefined8 *)*local_29c8;
        fStack_22bc = (float)((ulong)*(undefined8 *)*local_29c8 >> 0x20);
        fStack_22b8 = (float)*(undefined8 *)(*local_29c8 + 8);
        fStack_22b4 = (float)((ulong)*(undefined8 *)(*local_29c8 + 8) >> 0x20);
        fStack_22b0 = (float)*(undefined8 *)(*local_29c8 + 0x10);
        fStack_22ac = (float)((ulong)*(undefined8 *)(*local_29c8 + 0x10) >> 0x20);
        fStack_22a8 = (float)*(undefined8 *)(*local_29c8 + 0x18);
        fStack_22a4 = (float)((ulong)*(undefined8 *)(*local_29c8 + 0x18) >> 0x20);
        local_2a00 = local_2a00 + local_22c0;
        fStack_29fc = fStack_29fc + fStack_22bc;
        fStack_29f8 = fStack_29f8 + fStack_22b8;
        fStack_29f4 = fStack_29f4 + fStack_22b4;
        fStack_29f0 = fStack_29f0 + fStack_22b0;
        fStack_29ec = fStack_29ec + fStack_22ac;
        fStack_29e8 = fStack_29e8 + fStack_22a8;
        fStack_29e4 = fStack_29e4 + fStack_22a4;
        local_29c8 = local_29c8 + 1;
      }
      uVar8 = CONCAT44(fStack_29ec + fStack_29fc,fStack_29f0 + local_2a00);
      uVar9 = CONCAT44(fStack_29e4 + fStack_29f4,fStack_29e8 + fStack_29f8);
      auVar30._8_8_ = uVar9;
      auVar30._0_8_ = uVar8;
      auVar29._8_8_ = uVar9;
      auVar29._0_8_ = uVar8;
      auVar7 = vunpckhpd_avx(auVar29,auVar30);
      local_1eb0 = auVar7._0_4_;
      fStack_1eac = auVar7._4_4_;
      local_2a10 = 0;
      uStack_2a08 = 0;
      while( true ) {
        local_1d80 = (float)local_2a10;
        fStack_1d7c = (float)((ulong)local_2a10 >> 0x20);
        fStack_1d78 = (float)uStack_2a08;
        fStack_1d74 = (float)((ulong)uStack_2a08 >> 0x20);
        if (iVar58 <= local_29cc + 3) break;
        local_1d90 = (float)*(undefined8 *)*local_29c8;
        fStack_1d8c = (float)((ulong)*(undefined8 *)*local_29c8 >> 0x20);
        fStack_1d88 = (float)*(undefined8 *)(*local_29c8 + 8);
        fStack_1d84 = (float)((ulong)*(undefined8 *)(*local_29c8 + 8) >> 0x20);
        local_2a10 = CONCAT44(fStack_1d7c + fStack_1d8c,local_1d80 + local_1d90);
        uStack_2a08 = CONCAT44(fStack_1d74 + fStack_1d84,fStack_1d78 + fStack_1d88);
        local_29c8 = (undefined1 (*) [32])(*local_29c8 + 0x10);
        local_29cc = local_29cc + 4;
      }
      auVar20._8_8_ = uStack_2a08;
      auVar20._0_8_ = local_2a10;
      auVar19._8_8_ = uStack_2a08;
      auVar19._0_8_ = local_2a10;
      auVar7 = vunpckhpd_avx(auVar19,auVar20);
      local_1bc0 = auVar7._0_4_;
      fStack_1bbc = auVar7._4_4_;
      local_29bc = local_1d80 + local_1bc0 + fStack_1d7c + fStack_1bbc +
                   fStack_29f0 + local_2a00 + local_1eb0 + fStack_29ec + fStack_29fc + fStack_1eac +
                   0.0;
      for (; local_29cc < iVar58; local_29cc = local_29cc + 1) {
        local_29bc = *(float *)*local_29c8 + local_29bc;
        local_29c8 = (undefined1 (*) [32])(*local_29c8 + 4);
      }
      local_29bc = local_29bc / (float)iVar58;
      local_2a1c = 0;
      uStack_2378 = SUB328(ZEXT832(0),4);
      local_2a40 = 0;
      uStack_2a38 = uStack_2378;
      auVar7 = vinsertps_avx(ZEXT416((uint)local_29bc),ZEXT416((uint)local_29bc),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_29bc),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_29bc),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)local_29bc),ZEXT416((uint)local_29bc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_29bc),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_29bc),0x30);
      uStack_b30 = auVar7._0_8_;
      uStack_b28 = auVar7._8_8_;
      local_29c8 = pauVar62;
      for (; local_2a1c + 7 < iVar58; local_2a1c = local_2a1c + 8) {
        auVar10._16_8_ = uStack_b30;
        auVar10._0_16_ = auVar2;
        auVar10._24_8_ = uStack_b28;
        auVar69 = vsubps_avx(*local_29c8,auVar10);
        auVar7 = vfmadd213ps_fma(auVar69,auVar69,ZEXT1632(CONCAT88(uStack_2a38,local_2a40)));
        local_36a0 = auVar7._0_8_;
        local_2a40 = local_36a0;
        uStack_3698 = auVar7._8_8_;
        uStack_2a38 = uStack_3698;
        local_29c8 = local_29c8 + 1;
      }
      local_1e50 = (float)local_2a40;
      fStack_1e4c = (float)((ulong)local_2a40 >> 0x20);
      fStack_1e48 = (float)uStack_2a38;
      fStack_1e44 = (float)((ulong)uStack_2a38 >> 0x20);
      uVar8 = CONCAT44(fStack_1e4c + 0.0,local_1e50 + 0.0);
      uVar9 = CONCAT44(fStack_1e44 + 0.0,fStack_1e48 + 0.0);
      auVar32._8_8_ = uVar9;
      auVar32._0_8_ = uVar8;
      auVar31._8_8_ = uVar9;
      auVar31._0_8_ = uVar8;
      auVar7 = vunpckhpd_avx(auVar31,auVar32);
      local_1e70 = auVar7._0_4_;
      fStack_1e6c = auVar7._4_4_;
      local_2a90 = 0;
      uStack_2a88 = 0;
      auVar13._4_4_ = local_29bc;
      auVar13._0_4_ = local_29bc;
      auVar13._12_4_ = local_29bc;
      auVar13._8_4_ = local_29bc;
      for (; local_2a1c + 3 < iVar58; local_2a1c = local_2a1c + 4) {
        auVar7 = vsubps_avx(*(undefined1 (*) [16])*local_29c8,auVar13);
        auVar47._8_8_ = uStack_2a88;
        auVar47._0_8_ = local_2a90;
        auVar7 = vfmadd213ps_fma(auVar7,auVar7,auVar47);
        local_3700 = auVar7._0_8_;
        local_2a90 = local_3700;
        uStack_36f8 = auVar7._8_8_;
        uStack_2a88 = uStack_36f8;
        local_29c8 = (undefined1 (*) [32])(*local_29c8 + 0x10);
      }
      auVar22._8_8_ = uStack_2a88;
      auVar22._0_8_ = local_2a90;
      auVar21._8_8_ = uStack_2a88;
      auVar21._0_8_ = local_2a90;
      auVar7 = vunpckhpd_avx(auVar21,auVar22);
      local_1c00 = (float)local_2a90;
      fStack_1bfc = (float)((ulong)local_2a90 >> 0x20);
      local_1c10 = auVar7._0_4_;
      fStack_1c0c = auVar7._4_4_;
      local_2a18 = local_1c00 + local_1c10 + fStack_1bfc + fStack_1c0c +
                   local_1e50 + 0.0 + local_1e70 + fStack_1e4c + 0.0 + fStack_1e6c + 0.0;
      for (; local_2a1c < iVar58; local_2a1c = local_2a1c + 1) {
        fVar65 = *(float *)*local_29c8 - local_29bc;
        local_2a18 = fVar65 * fVar65 + local_2a18;
        local_29c8 = (undefined1 (*) [32])(*local_29c8 + 4);
      }
      auVar67._0_4_ = local_2a18 / (float)iVar58;
      auVar67._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar7 = vsqrtss_avx(auVar67,ZEXT416((uint)(auVar67._0_4_ + *(float *)(in_RDI + 0xd8))));
      fVar63 = 1.0 / auVar7._0_4_;
      fVar65 = -local_29bc * fVar63;
      if (*(int *)(in_RDI + 0xdc) == 0) {
        local_2b74 = 0;
        auVar7 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar63),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar63),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar63),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar63),0x30);
        uStack_a70 = auVar7._0_8_;
        uStack_a68 = auVar7._8_8_;
        auVar7 = vinsertps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar65),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar65),0x30);
        auVar3 = vinsertps_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar65),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar65),0x30);
        uStack_a30 = auVar7._0_8_;
        uStack_a28 = auVar7._8_8_;
        local_29c8 = pauVar62;
        for (; local_2b74 + 7 < iVar58; local_2b74 = local_2b74 + 8) {
          auVar42._16_8_ = uStack_a70;
          auVar42._0_16_ = auVar2;
          auVar42._24_8_ = uStack_a68;
          auVar41._16_8_ = uStack_a30;
          auVar41._0_16_ = auVar3;
          auVar41._24_8_ = uStack_a28;
          auVar7 = vfmadd213ps_fma(auVar42,*local_29c8,auVar41);
          local_38e0 = auVar7._0_8_;
          uStack_38d8 = auVar7._8_8_;
          *(undefined8 *)*local_29c8 = local_38e0;
          *(undefined8 *)(*local_29c8 + 8) = uStack_38d8;
          *(undefined8 *)(*local_29c8 + 0x10) = 0;
          *(undefined8 *)(*local_29c8 + 0x18) = 0;
          local_29c8 = local_29c8 + 1;
        }
        auVar40._4_4_ = fVar63;
        auVar40._0_4_ = fVar63;
        auVar40._12_4_ = fVar63;
        auVar40._8_4_ = fVar63;
        auVar39._4_4_ = fVar65;
        auVar39._0_4_ = fVar65;
        auVar39._12_4_ = fVar65;
        auVar39._8_4_ = fVar65;
        for (; local_2b74 + 3 < iVar58; local_2b74 = local_2b74 + 4) {
          auVar7 = vfmadd213ps_fma(auVar40,*(undefined1 (*) [16])*local_29c8,auVar39);
          local_3920 = auVar7._0_8_;
          uStack_3918 = auVar7._8_8_;
          *(undefined8 *)*local_29c8 = local_3920;
          *(undefined8 *)(*local_29c8 + 8) = uStack_3918;
          local_29c8 = (undefined1 (*) [32])(*local_29c8 + 0x10);
        }
        for (; local_2b74 < iVar58; local_2b74 = local_2b74 + 1) {
          *(float *)*local_29c8 = *(float *)*local_29c8 * fVar63 + fVar65;
          local_29c8 = (undefined1 (*) [32])(*local_29c8 + 4);
        }
      }
      else {
        local_29c8 = pauVar62;
        for (local_2ad4 = 0; local_2ad4 < iVar57; local_2ad4 = local_2ad4 + 1) {
          fVar5 = *local_2ac8 * fVar63;
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar65),ZEXT416((uint)*local_2ac8),
                                   ZEXT416(*local_2ad0));
          fVar64 = auVar7._0_4_;
          local_2ae0 = 0;
          auVar7 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar5),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar5),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar5),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar5),0x30);
          uStack_af0 = auVar7._0_8_;
          uStack_ae8 = auVar7._8_8_;
          auVar7 = vinsertps_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar64),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar64),0x30);
          auVar3 = vinsertps_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar64),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar64),0x30);
          uStack_ab0 = auVar7._0_8_;
          uStack_aa8 = auVar7._8_8_;
          for (; local_2ae0 + 7 < iVar59; local_2ae0 = local_2ae0 + 8) {
            auVar46._16_8_ = uStack_af0;
            auVar46._0_16_ = auVar2;
            auVar46._24_8_ = uStack_ae8;
            auVar45._16_8_ = uStack_ab0;
            auVar45._0_16_ = auVar3;
            auVar45._24_8_ = uStack_aa8;
            auVar7 = vfmadd213ps_fma(auVar46,*local_29c8,auVar45);
            local_37e0 = auVar7._0_8_;
            uStack_37d8 = auVar7._8_8_;
            *(undefined8 *)*local_29c8 = local_37e0;
            *(undefined8 *)(*local_29c8 + 8) = uStack_37d8;
            *(undefined8 *)(*local_29c8 + 0x10) = 0;
            *(undefined8 *)(*local_29c8 + 0x18) = 0;
            local_29c8 = local_29c8 + 1;
          }
          auVar44._4_4_ = fVar5;
          auVar44._0_4_ = fVar5;
          auVar44._12_4_ = fVar5;
          auVar44._8_4_ = fVar5;
          auVar43._4_4_ = fVar64;
          auVar43._0_4_ = fVar64;
          auVar43._12_4_ = fVar64;
          auVar43._8_4_ = fVar64;
          for (; local_2ae0 + 3 < iVar59; local_2ae0 = local_2ae0 + 4) {
            auVar7 = vfmadd213ps_fma(auVar44,*(undefined1 (*) [16])*local_29c8,auVar43);
            local_3820 = auVar7._0_8_;
            uStack_3818 = auVar7._8_8_;
            *(undefined8 *)*local_29c8 = local_3820;
            *(undefined8 *)(*local_29c8 + 8) = uStack_3818;
            local_29c8 = (undefined1 (*) [32])(*local_29c8 + 0x10);
          }
          for (; local_2ae0 < iVar59; local_2ae0 = local_2ae0 + 1) {
            *(float *)*local_29c8 = *(float *)*local_29c8 * fVar5 + fVar64;
            local_29c8 = (undefined1 (*) [32])(*local_29c8 + 4);
          }
          local_2ac8 = local_2ac8 + 1;
          local_2ad0 = local_2ad0 + 1;
        }
      }
    }
  }
  else if ((iVar59 == 3) || (iVar59 == 4)) {
    iVar59 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
    for (local_2c24 = 0; local_2c24 < *(int *)(in_RDI + 0xd0); local_2c24 = local_2c24 + 1) {
      lVar61 = *in_RSI + in_RSI[8] * (long)(local_2c24 * iVar57) * in_RSI[2];
      uVar1 = in_RSI[2];
      uVar60 = ((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
                (long)*(int *)((long)in_RSI + 0x34) * uVar1 + 0xf & 0xfffffffffffffff0) / uVar1;
      local_2ea8 = (float *)(*(long *)(in_RDI + 0xe0) +
                            (long)(local_2c24 * iVar57) * *(long *)(in_RDI + 0xf0));
      local_2eb0 = (float *)(*(long *)(in_RDI + 0x128) +
                            (long)(local_2c24 * iVar57) * *(long *)(in_RDI + 0x138));
      local_2d04 = 0.0;
      for (local_2d08 = 0; local_2d08 < iVar57; local_2d08 = local_2d08 + 1) {
        local_2d10 = (float *)(lVar61 + uVar60 * (long)local_2d08 * uVar1);
        local_2d80 = 0.0;
        fStack_2d7c = 0.0;
        fStack_2d78 = 0.0;
        fStack_2d74 = 0.0;
        fStack_2d70 = 0.0;
        fStack_2d6c = 0.0;
        fStack_2d68 = 0.0;
        fStack_2d64 = 0.0;
        for (local_2d5c = 0; local_2d5c + 7 < iVar59; local_2d5c = local_2d5c + 8) {
          local_2300 = (float)*(undefined8 *)local_2d10;
          fStack_22fc = (float)((ulong)*(undefined8 *)local_2d10 >> 0x20);
          fStack_22f8 = (float)*(undefined8 *)(local_2d10 + 2);
          fStack_22f4 = (float)((ulong)*(undefined8 *)(local_2d10 + 2) >> 0x20);
          fStack_22f0 = (float)*(undefined8 *)(local_2d10 + 4);
          fStack_22ec = (float)((ulong)*(undefined8 *)(local_2d10 + 4) >> 0x20);
          fStack_22e8 = (float)*(undefined8 *)(local_2d10 + 6);
          fStack_22e4 = (float)((ulong)*(undefined8 *)(local_2d10 + 6) >> 0x20);
          local_2d80 = local_2d80 + local_2300;
          fStack_2d7c = fStack_2d7c + fStack_22fc;
          fStack_2d78 = fStack_2d78 + fStack_22f8;
          fStack_2d74 = fStack_2d74 + fStack_22f4;
          fStack_2d70 = fStack_2d70 + fStack_22f0;
          fStack_2d6c = fStack_2d6c + fStack_22ec;
          fStack_2d68 = fStack_2d68 + fStack_22e8;
          fStack_2d64 = fStack_2d64 + fStack_22e4;
          local_2d10 = local_2d10 + 8;
        }
        uVar8 = CONCAT44(fStack_2d6c + fStack_2d7c,fStack_2d70 + local_2d80);
        uVar9 = CONCAT44(fStack_2d64 + fStack_2d74,fStack_2d68 + fStack_2d78);
        auVar2._8_8_ = uVar9;
        auVar2._0_8_ = uVar8;
        auVar7._8_8_ = uVar9;
        auVar7._0_8_ = uVar8;
        auVar7 = vunpckhpd_avx(auVar7,auVar2);
        local_1e30 = auVar7._0_4_;
        fStack_1e2c = auVar7._4_4_;
        local_2d90 = 0;
        uStack_2d88 = 0;
        while( true ) {
          local_1da0 = (float)local_2d90;
          fStack_1d9c = (float)((ulong)local_2d90 >> 0x20);
          fStack_1d98 = (float)uStack_2d88;
          fStack_1d94 = (float)((ulong)uStack_2d88 >> 0x20);
          if (iVar59 <= local_2d5c + 3) break;
          local_1db0 = (float)*(undefined8 *)local_2d10;
          fStack_1dac = (float)((ulong)*(undefined8 *)local_2d10 >> 0x20);
          fStack_1da8 = (float)*(undefined8 *)(local_2d10 + 2);
          fStack_1da4 = (float)((ulong)*(undefined8 *)(local_2d10 + 2) >> 0x20);
          local_2d90 = CONCAT44(fStack_1d9c + fStack_1dac,local_1da0 + local_1db0);
          uStack_2d88 = CONCAT44(fStack_1d94 + fStack_1da4,fStack_1d98 + fStack_1da8);
          local_2d10 = local_2d10 + 4;
          local_2d5c = local_2d5c + 4;
        }
        auVar4._8_8_ = uStack_2d88;
        auVar4._0_8_ = local_2d90;
        auVar3._8_8_ = uStack_2d88;
        auVar3._0_8_ = local_2d90;
        auVar7 = vunpckhpd_avx(auVar3,auVar4);
        local_1c60 = auVar7._0_4_;
        fStack_1c5c = auVar7._4_4_;
        local_2d04 = local_1da0 + local_1c60 + fStack_1d9c + fStack_1c5c +
                     local_2d04 +
                     fStack_2d70 + local_2d80 + local_1e30 + fStack_2d6c + fStack_2d7c + fStack_1e2c
        ;
        for (; local_2d5c < iVar59; local_2d5c = local_2d5c + 1) {
          local_2d04 = *local_2d10 + local_2d04;
          local_2d10 = local_2d10 + 1;
        }
      }
      local_2d04 = local_2d04 / (float)(iVar57 * iVar59);
      local_2d98 = 0.0;
      for (local_2d9c = 0; local_2d9c < iVar57; local_2d9c = local_2d9c + 1) {
        local_2da8 = (undefined1 (*) [32])(lVar61 + uVar60 * (long)local_2d9c * uVar1);
        local_2df4 = 0;
        local_2e20 = 0;
        uStack_2e18 = 0;
        auVar7 = vinsertps_avx(ZEXT416((uint)local_2d04),ZEXT416((uint)local_2d04),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_2d04),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_2d04),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_2d04),ZEXT416((uint)local_2d04),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2d04),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2d04),0x30);
        auVar69._16_16_ = auVar7;
        auVar69._0_16_ = auVar2;
        for (; local_2df4 + 7 < iVar59; local_2df4 = local_2df4 + 8) {
          auVar6 = vsubps_avx(*local_2da8,auVar69);
          auVar7 = vfmadd213ps_fma(auVar6,auVar6,ZEXT1632(CONCAT88(uStack_2e18,local_2e20)));
          local_3b60 = auVar7._0_8_;
          local_2e20 = local_3b60;
          uStack_3b58 = auVar7._8_8_;
          uStack_2e18 = uStack_3b58;
          local_2da8 = local_2da8 + 1;
        }
        local_1dd0 = (float)local_2e20;
        fStack_1dcc = (float)((ulong)local_2e20 >> 0x20);
        fStack_1dc8 = (float)uStack_2e18;
        fStack_1dc4 = (float)((ulong)uStack_2e18 >> 0x20);
        uVar8 = CONCAT44(fStack_1dcc + 0.0,local_1dd0 + 0.0);
        uVar9 = CONCAT44(fStack_1dc4 + 0.0,fStack_1dc8 + 0.0);
        auVar34._8_8_ = uVar9;
        auVar34._0_8_ = uVar8;
        auVar33._8_8_ = uVar9;
        auVar33._0_8_ = uVar8;
        auVar7 = vunpckhpd_avx(auVar33,auVar34);
        local_1df0 = auVar7._0_4_;
        fStack_1dec = auVar7._4_4_;
        local_2e70 = 0;
        uStack_2e68 = 0;
        auVar12._4_4_ = local_2d04;
        auVar12._0_4_ = local_2d04;
        auVar12._12_4_ = local_2d04;
        auVar12._8_4_ = local_2d04;
        for (; local_2df4 + 3 < iVar59; local_2df4 = local_2df4 + 4) {
          auVar7 = vsubps_avx(*(undefined1 (*) [16])*local_2da8,auVar12);
          auVar38._8_8_ = uStack_2e68;
          auVar38._0_8_ = local_2e70;
          auVar7 = vfmadd213ps_fma(auVar7,auVar7,auVar38);
          local_3bc0 = auVar7._0_8_;
          local_2e70 = local_3bc0;
          uStack_3bb8 = auVar7._8_8_;
          uStack_2e68 = uStack_3bb8;
          local_2da8 = (undefined1 (*) [32])(*local_2da8 + 0x10);
        }
        auVar24._8_8_ = uStack_2e68;
        auVar24._0_8_ = local_2e70;
        auVar23._8_8_ = uStack_2e68;
        auVar23._0_8_ = local_2e70;
        auVar7 = vunpckhpd_avx(auVar23,auVar24);
        local_1ca0 = (float)local_2e70;
        fStack_1c9c = (float)((ulong)local_2e70 >> 0x20);
        local_1cb0 = auVar7._0_4_;
        fStack_1cac = auVar7._4_4_;
        local_2d98 = local_1ca0 + local_1cb0 + fStack_1c9c + fStack_1cac +
                     local_2d98 + local_1dd0 + 0.0 + local_1df0 + fStack_1dcc + 0.0 + fStack_1dec;
        for (; local_2df4 < iVar59; local_2df4 = local_2df4 + 1) {
          fVar65 = *(float *)*local_2da8 - local_2d04;
          local_2d98 = fVar65 * fVar65 + local_2d98;
          local_2da8 = (undefined1 (*) [32])(*local_2da8 + 4);
        }
      }
      auVar68._0_4_ = local_2d98 / (float)(iVar57 * iVar59);
      auVar68._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar7 = vsqrtss_avx(auVar68,ZEXT416((uint)(auVar68._0_4_ + *(float *)(in_RDI + 0xd8))));
      fVar65 = 1.0 / auVar7._0_4_;
      for (local_2eb4 = 0; local_2eb4 < iVar57; local_2eb4 = local_2eb4 + 1) {
        local_2ebc = -local_2d04 * fVar65;
        local_2eb8 = fVar65;
        if (*(int *)(in_RDI + 0xdc) != 0) {
          local_2eb8 = *local_2ea8 * fVar65;
          local_2ebc = *local_2ea8 * -local_2d04 * fVar65 + *local_2eb0;
        }
        local_2ec8 = (undefined1 (*) [32])(lVar61 + uVar60 * (long)local_2eb4 * uVar1);
        local_2f14 = 0;
        auVar7 = vinsertps_avx(ZEXT416((uint)local_2eb8),ZEXT416((uint)local_2eb8),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_2eb8),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_2eb8),0x30);
        auVar2 = vinsertps_avx(ZEXT416((uint)local_2eb8),ZEXT416((uint)local_2eb8),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2eb8),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_2eb8),0x30);
        uStack_9b0 = auVar7._0_8_;
        uStack_9a8 = auVar7._8_8_;
        auVar7 = vinsertps_avx(ZEXT416((uint)local_2ebc),ZEXT416((uint)local_2ebc),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_2ebc),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_2ebc),0x30);
        auVar3 = vinsertps_avx(ZEXT416((uint)local_2ebc),ZEXT416((uint)local_2ebc),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_2ebc),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_2ebc),0x30);
        uStack_970 = auVar7._0_8_;
        uStack_968 = auVar7._8_8_;
        for (; local_2f14 + 7 < iVar59; local_2f14 = local_2f14 + 8) {
          auVar37._16_8_ = uStack_9b0;
          auVar37._0_16_ = auVar2;
          auVar37._24_8_ = uStack_9a8;
          auVar6._16_8_ = uStack_970;
          auVar6._0_16_ = auVar3;
          auVar6._24_8_ = uStack_968;
          auVar7 = vfmadd213ps_fma(auVar37,*local_2ec8,auVar6);
          local_3cc0 = auVar7._0_8_;
          uStack_3cb8 = auVar7._8_8_;
          *(undefined8 *)*local_2ec8 = local_3cc0;
          *(undefined8 *)(*local_2ec8 + 8) = uStack_3cb8;
          *(undefined8 *)(*local_2ec8 + 0x10) = 0;
          *(undefined8 *)(*local_2ec8 + 0x18) = 0;
          local_2ec8 = local_2ec8 + 1;
        }
        auVar36._4_4_ = local_2eb8;
        auVar36._0_4_ = local_2eb8;
        auVar36._12_4_ = local_2eb8;
        auVar36._8_4_ = local_2eb8;
        auVar35._4_4_ = local_2ebc;
        auVar35._0_4_ = local_2ebc;
        auVar35._12_4_ = local_2ebc;
        auVar35._8_4_ = local_2ebc;
        for (; local_2f14 + 3 < iVar59; local_2f14 = local_2f14 + 4) {
          auVar7 = vfmadd213ps_fma(auVar36,*(undefined1 (*) [16])*local_2ec8,auVar35);
          local_3d00 = auVar7._0_8_;
          uStack_3cf8 = auVar7._8_8_;
          *(undefined8 *)*local_2ec8 = local_3d00;
          *(undefined8 *)(*local_2ec8 + 8) = uStack_3cf8;
          local_2ec8 = (undefined1 (*) [32])(*local_2ec8 + 0x10);
        }
        for (; local_2f14 < iVar59; local_2f14 = local_2f14 + 1) {
          *(float *)*local_2ec8 = *(float *)*local_2ec8 * local_2eb8 + local_2ebc;
          local_2ec8 = (undefined1 (*) [32])(*local_2ec8 + 4);
        }
        local_2ea8 = local_2ea8 + 1;
        local_2eb0 = local_2eb0 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}